

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O0

void conv_direct(double *inp1,int N,double *inp2,int L,double *oup)

{
  int iVar1;
  int iVar2;
  double local_60;
  double local_58;
  double tmin;
  double t1;
  int i;
  int m;
  int k;
  int M;
  double *oup_local;
  int L_local;
  double *inp2_local;
  int N_local;
  double *inp1_local;
  
  iVar2 = N + L + -1;
  t1._0_4_ = 0;
  if (N < L) {
    for (i = 0; iVar1 = N, i < N; i = i + 1) {
      oup[i] = 0.0;
      for (t1._4_4_ = 0; t1._4_4_ <= i; t1._4_4_ = t1._4_4_ + 1) {
        oup[i] = inp2[t1._4_4_] * inp1[i - t1._4_4_] + oup[i];
      }
    }
    while (i = iVar1, i < iVar2) {
      oup[i] = 0.0;
      t1._0_4_ = t1._0_4_ + 1;
      local_60 = (double)N + (double)t1._0_4_;
      t1._4_4_ = t1._0_4_;
      if ((double)L <= local_60) {
        local_60 = (double)L;
      }
      for (; (double)t1._4_4_ < local_60; t1._4_4_ = t1._4_4_ + 1) {
        oup[i] = inp2[t1._4_4_] * inp1[i - t1._4_4_] + oup[i];
      }
      iVar1 = i + 1;
    }
  }
  else {
    for (i = 0; iVar1 = L, i < L; i = i + 1) {
      oup[i] = 0.0;
      for (t1._4_4_ = 0; t1._4_4_ <= i; t1._4_4_ = t1._4_4_ + 1) {
        oup[i] = inp1[t1._4_4_] * inp2[i - t1._4_4_] + oup[i];
      }
    }
    while (i = iVar1, i < iVar2) {
      oup[i] = 0.0;
      t1._0_4_ = t1._0_4_ + 1;
      local_58 = (double)L + (double)t1._0_4_;
      t1._4_4_ = t1._0_4_;
      if ((double)N <= local_58) {
        local_58 = (double)N;
      }
      for (; (double)t1._4_4_ < local_58; t1._4_4_ = t1._4_4_ + 1) {
        oup[i] = inp1[t1._4_4_] * inp2[i - t1._4_4_] + oup[i];
      }
      iVar1 = i + 1;
    }
  }
  return;
}

Assistant:

void conv_direct(fft_type *inp1,int N, fft_type *inp2, int L,fft_type *oup) {

	int M,k,m,i;
	fft_type t1,tmin;

	M = N + L -1;
	i = 0;

	if (N >= L) {

		for (k = 0; k < L; k++) {
			oup[k] = 0.0;
			for (m = 0; m <= k;m++) {
				oup[k]+= inp1[m] * inp2[k-m];
			}
		}

		for (k = L; k < M; k++) {
			oup[k] = 0.0;
			i++;
			t1 = (fft_type) L + i;
			tmin = MIN(t1,N);
			for (m = i; m < tmin;m++) {
				oup[k]+= inp1[m] * inp2[k-m];
			}
		}


	} else {
		for (k = 0; k < N; k++) {
			oup[k] = 0.0;
			for (m = 0; m <= k;m++) {
				oup[k]+= inp2[m] * inp1[k-m];
			}
		}

		for (k = N; k < M; k++) {
			oup[k] = 0.0;
			i++;
			t1 = (fft_type) N + i;
			tmin = MIN(t1,L);
			for (m = i; m < tmin;m++) {
				oup[k]+= inp2[m] * inp1[k-m];
			}
		}

	}


}